

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall QPlainTextEdit::mousePressEvent(QPlainTextEdit *this,QMouseEvent *e)

{
  QPlainTextEditPrivate *d;
  QPlainTextEditPrivate *in_stack_00000018;
  
  d_func((QPlainTextEdit *)0x6c6bcc);
  QPlainTextEditPrivate::sendControlEvent(in_stack_00000018,(QEvent *)this);
  return;
}

Assistant:

void QPlainTextEdit::mousePressEvent(QMouseEvent *e)
{
    Q_D(QPlainTextEdit);
#ifdef QT_KEYPAD_NAVIGATION
    if (QApplicationPrivate::keypadNavigationEnabled() && !hasEditFocus())
        setEditFocus(true);
#endif
    d->sendControlEvent(e);
}